

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int ASN1_STRING_to_UTF8(uchar **out,ASN1_STRING *in)

{
  ASN1_STRING *pAStack_48;
  int ret;
  ASN1_STRING *str;
  ASN1_STRING stmp;
  int mbflag;
  ASN1_STRING *in_local;
  uchar **out_local;
  
  if (in == (ASN1_STRING *)0x0) {
    out_local._4_4_ = -1;
  }
  else {
    stmp.flags._4_4_ = string_type_to_encoding(in->type);
    if (stmp.flags._4_4_ == -1) {
      ERR_put_error(0xc,0,0xb9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                    ,0x147);
      out_local._4_4_ = -1;
    }
    else {
      pAStack_48 = (ASN1_STRING *)&str;
      stmp.length = 0;
      stmp.type = 0;
      str._0_4_ = 0;
      stmp.data = (uchar *)0x0;
      out_local._4_4_ =
           ASN1_mbstring_copy(&stack0xffffffffffffffb8,in->data,in->length,stmp.flags._4_4_,0x2000);
      if (-1 < out_local._4_4_) {
        *out = (uchar *)stmp._0_8_;
        out_local._4_4_ = (int)str;
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

int ASN1_STRING_to_UTF8(unsigned char **out, const ASN1_STRING *in) {
  if (!in) {
    return -1;
  }
  int mbflag = string_type_to_encoding(in->type);
  if (mbflag == -1) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_TAG);
    return -1;
  }
  ASN1_STRING stmp, *str = &stmp;
  stmp.data = NULL;
  stmp.length = 0;
  stmp.flags = 0;
  int ret =
      ASN1_mbstring_copy(&str, in->data, in->length, mbflag, B_ASN1_UTF8STRING);
  if (ret < 0) {
    return ret;
  }
  *out = stmp.data;
  return stmp.length;
}